

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::PackedFixed32::~PackedFixed32(PackedFixed32 *this)

{
  PackedFixed32 *this_local;
  
  ~PackedFixed32(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

PackedFixed32::~PackedFixed32() {
  // @@protoc_insertion_point(destructor:proto2_unittest.PackedFixed32)
  SharedDtor(*this);
}